

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O2

void __thiscall
FIX42::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,HandlInst *aHandlInst,Symbol *aSymbol,Side *aSide,
          TransactTime *aTransactTime,OrdType *aOrdType)

{
  FieldBase local_88;
  
  MsgType();
  FIX42::Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_002f8000;
  set(this,aClOrdID);
  set(this,aHandlInst);
  set(this,aSymbol);
  set(this,aSide);
  set(this,aTransactTime);
  set(this,aOrdType);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::HandlInst& aHandlInst,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aHandlInst);
      set(aSymbol);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }